

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O3

double __thiscall osc::ReceivedMessageArgument::AsDouble(ReceivedMessageArgument *this)

{
  undefined8 *puVar1;
  pointer_____offset_0x10___ *ppuVar2;
  double dVar3;
  
  if (this->typeTagPtr_ == (char *)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar1[1] = "missing argument";
    *puVar1 = &PTR__exception_0010cc00;
    ppuVar2 = &MissingArgumentException::typeinfo;
  }
  else {
    if (*this->typeTagPtr_ == 'd') {
      dVar3 = AsDoubleUnchecked(this);
      return dVar3;
    }
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar1[1] = "wrong argument type";
    *puVar1 = &PTR__exception_0010cc28;
    ppuVar2 = &WrongArgumentTypeException::typeinfo;
  }
  __cxa_throw(puVar1,ppuVar2,std::exception::~exception);
}

Assistant:

double ReceivedMessageArgument::AsDouble() const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == DOUBLE_TYPE_TAG )
		return AsDoubleUnchecked();
	else
		throw WrongArgumentTypeException();
}